

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_common.c
# Opt level: O0

void set_loop_restoration_done(AV1LrSync *lr_sync,FilterFrameCtxt *ctxt)

{
  int iVar1;
  int iVar2;
  int iVar3;
  void *in_RSI;
  int h;
  int remaining_h;
  int hnum_rest_units;
  int ext_size;
  int plane_h;
  int unit_size;
  int row_number;
  int y0;
  int plane;
  int local_38;
  int plane_00;
  int sb_cols;
  int c;
  int r;
  
  for (r = 0; r < 3; r = r + 1) {
    if (**(int **)((long)in_RSI + (long)r * 0x38) != 0) {
      sb_cols = 0;
      plane_00 = *(int *)(*(long *)((long)in_RSI + (long)r * 0x38) + 4);
      iVar1 = *(int *)((long)in_RSI + (long)r * 0x38 + 0x14);
      iVar2 = plane_00 * 3;
      for (c = 0; c < iVar1; c = local_38 + c) {
        iVar3 = iVar1 - c;
        local_38 = plane_00;
        if (iVar3 < iVar2 / 2) {
          local_38 = iVar3;
        }
        lr_sync_write(in_RSI,r,c,sb_cols,plane_00);
        sb_cols = sb_cols + 1;
      }
    }
  }
  return;
}

Assistant:

static void set_loop_restoration_done(AV1LrSync *const lr_sync,
                                      FilterFrameCtxt *const ctxt) {
  for (int plane = 0; plane < MAX_MB_PLANE; ++plane) {
    if (ctxt[plane].rsi->frame_restoration_type == RESTORE_NONE) continue;
    int y0 = 0, row_number = 0;
    const int unit_size = ctxt[plane].rsi->restoration_unit_size;
    const int plane_h = ctxt[plane].plane_h;
    const int ext_size = unit_size * 3 / 2;
    const int hnum_rest_units = ctxt[plane].rsi->horz_units;
    while (y0 < plane_h) {
      const int remaining_h = plane_h - y0;
      const int h = (remaining_h < ext_size) ? remaining_h : unit_size;
      lr_sync_write(lr_sync, row_number, hnum_rest_units - 1, hnum_rest_units,
                    plane);
      y0 += h;
      ++row_number;
    }
  }
}